

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratbuilder.cpp
# Opt level: O3

void __thiscall CaDiCaL::LratBuilder::collect_garbage_clauses(LratBuilder *this)

{
  int64_t *piVar1;
  vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_> *this_00;
  pointer pvVar2;
  pointer pLVar3;
  LratBuilderClause *pLVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  LratBuilderClause *pLVar7;
  int iVar8;
  uint uVar9;
  pointer ppLVar10;
  iterator i;
  pointer pLVar11;
  pointer ppLVar12;
  LratBuilderWatch *w;
  pointer pLVar13;
  long lVar14;
  ulong uVar15;
  pointer ppLVar16;
  pointer ppLVar17;
  int iVar18;
  long lVar19;
  
  piVar1 = &(this->stats).collections;
  *piVar1 = *piVar1 + 1;
  lVar19 = (long)(1 - (int)this->size_vars);
  if (lVar19 < this->size_vars) {
    do {
      if (lVar19 != 0) {
        iVar18 = (int)lVar19;
        iVar8 = -iVar18;
        if (0 < iVar18) {
          iVar8 = iVar18;
        }
        uVar9 = ~(uint)(-1 < lVar19) + iVar8 * 2;
        pvVar2 = (this->watchers).
                 super__Vector_base<std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>,_std::allocator<std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar11 = pvVar2[uVar9].
                  super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pLVar3 = *(pointer *)
                  ((long)&pvVar2[uVar9].
                          super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if (pLVar11 != pLVar3) {
          this_00 = pvVar2 + uVar9;
          pLVar13 = pLVar11;
          do {
            if (pLVar13->clause->garbage == false) {
              uVar9 = pLVar13->size;
              uVar5 = *(undefined4 *)&pLVar13->clause;
              uVar6 = *(undefined4 *)((long)&pLVar13->clause + 4);
              pLVar11->blit = pLVar13->blit;
              pLVar11->size = uVar9;
              *(undefined4 *)&pLVar11->clause = uVar5;
              *(undefined4 *)((long)&pLVar11->clause + 4) = uVar6;
              pLVar11 = pLVar11 + 1;
            }
            pLVar13 = pLVar13 + 1;
          } while (pLVar13 != pLVar3);
          if (pLVar11 !=
              (this_00->
              super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            pLVar3 = (this_00->
                     super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar14 = (long)pLVar11 - (long)pLVar3;
            if (lVar14 == 0) {
              uVar15 = (long)(this_00->
                             super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                             )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar11;
              if (uVar15 != 0) {
                (this_00->
                super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (this_00->
                super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (this_00->
                super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (pLVar11 != (pointer)0x0) {
                  operator_delete(pLVar3,uVar15);
                }
              }
            }
            else {
              std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::
              resize(this_00,lVar14 >> 4);
            }
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < this->size_vars);
  }
  ppLVar12 = (this->unit_clauses).
             super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppLVar10 = (this->unit_clauses).
             super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar16 = ppLVar12;
  ppLVar17 = ppLVar10;
  if (ppLVar12 != ppLVar10) {
    do {
      if ((*ppLVar12)->garbage == false) {
        *ppLVar16 = *ppLVar12;
        ppLVar16 = ppLVar16 + 1;
      }
      ppLVar12 = ppLVar12 + 1;
    } while (ppLVar12 != ppLVar10);
    ppLVar10 = (this->unit_clauses).
               super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar17 = ppLVar16;
  }
  std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::resize
            (&this->unit_clauses,(long)ppLVar17 - (long)ppLVar10 >> 3);
  pLVar7 = this->garbage;
  while (pLVar7 != (LratBuilderClause *)0x0) {
    pLVar4 = pLVar7->next;
    (&this->num_clauses)[pLVar7->garbage] = (&this->num_clauses)[pLVar7->garbage] - 1;
    operator_delete__(pLVar7);
    pLVar7 = pLVar4;
  }
  this->garbage = (LratBuilderClause *)0x0;
  return;
}

Assistant:

void LratBuilder::collect_garbage_clauses () {

  stats.collections++;

  LOG ("LRAT BUILDER collecting %" PRIu64 " garbage clauses %.0f%%",
       num_garbage, percent (num_garbage, num_clauses));

  for (int lit = -size_vars + 1; lit < size_vars; lit++) {
    if (!lit)
      continue;
    LratBuilderWatcher &ws = watcher (lit);
    const auto end = ws.end ();
    auto j = ws.begin (), i = j;
    for (; i != end; i++) {
      LratBuilderWatch &w = *i;
      if (!w.clause->garbage)
        *j++ = w;
    }
    if (j == ws.end ())
      continue;
    if (j == ws.begin ())
      erase_vector (ws);
    else
      ws.resize (j - ws.begin ());
  }

  const auto end = unit_clauses.end ();
  auto j = unit_clauses.begin ();
  for (auto i = j; i != end; i++) {
    LratBuilderClause *c = *i;
    if (c->garbage)
      continue; // garbage clause
    *j++ = c;
  }
  unit_clauses.resize (j - unit_clauses.begin ());

  for (LratBuilderClause *c = garbage, *next; c; c = next)
    next = c->next, delete_clause (c);

  assert (!num_garbage);
  garbage = 0;
}